

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

double __thiscall
Fl_Text_Display::measure_proportional_character(Fl_Text_Display *this,char *s,int xPix,int pos)

{
  char cVar1;
  int iVar2;
  double dVar3;
  int local_34;
  int style;
  int charLen;
  int tab;
  int pos_local;
  int xPix_local;
  char *s_local;
  Fl_Text_Display *this_local;
  
  if (*s == '\t') {
    iVar2 = Fl_Text_Buffer::tab_distance(this->mBuffer);
    dVar3 = col_to_x(this,(double)iVar2);
    this_local = (Fl_Text_Display *)(double)((xPix / (int)dVar3 + 1) * (int)dVar3 - xPix);
  }
  else {
    iVar2 = fl_utf8len1(*s);
    local_34 = 0;
    if (this->mStyleBuffer != (Fl_Text_Buffer *)0x0) {
      cVar1 = Fl_Text_Buffer::byte_at(this->mStyleBuffer,pos);
      local_34 = (int)cVar1;
    }
    this_local = (Fl_Text_Display *)string_width(this,s,iVar2,local_34);
  }
  return (double)this_local;
}

Assistant:

double Fl_Text_Display::measure_proportional_character(const char *s, int xPix, int pos) const {
  IS_UTF8_ALIGNED(s)

  if (*s=='\t') {
    int tab = (int)col_to_x(mBuffer->tab_distance());
    return (((xPix/tab)+1)*tab) - xPix;
  }

  int charLen = fl_utf8len1(*s), style = 0;
  if (mStyleBuffer) {
    style = mStyleBuffer->byte_at(pos);
  }
  return string_width(s, charLen, style);
}